

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_doc *
duckdb_yyjson::read_root_single
          (u8 *hdr,u8 *cur,u8 *end,yyjson_alc alc,yyjson_read_flag flg,yyjson_read_err *err)

{
  code *pcVar1;
  code cVar2;
  undefined2 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ushort uVar23;
  bool bVar24;
  yyjson_read_code yVar25;
  uint uVar26;
  uint uVar27;
  yyjson_doc *pyVar28;
  ulong uVar29;
  u8 *puVar30;
  ulong uVar31;
  _func_void_ptr_void_ptr_size_t *p_Var32;
  byte bVar33;
  sbyte sVar34;
  _func_void_ptr_void_ptr_size_t *p_Var35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  char *pcVar39;
  u64 uVar40;
  _func_void_ptr_void_ptr_size_t *p_Var41;
  uint uVar42;
  u64 *__s;
  _func_void_ptr_void_ptr_size_t *p_Var43;
  byte bVar44;
  yyjson_val *pyVar45;
  ulong uVar46;
  u8 **ppuVar47;
  _func_void_ptr_void_ptr_size_t *sig_cut;
  int iVar48;
  int iVar49;
  yyjson_doc *val;
  _func_void_ptr_void_ptr_size_t *p_Var50;
  ulong uVar51;
  char cVar52;
  bigint *big;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  char *msg;
  i32 exp;
  u8 *raw_end;
  bigint big_full;
  _func_void_ptr_void_ptr_size_t *local_4c0;
  _func_void_ptr_void_ptr_size_t *local_4b8;
  yyjson_doc *local_4b0;
  u8 *local_4a8;
  u8 **local_4a0;
  yyjson_read_flag local_494;
  ulong local_490;
  char *local_488;
  _func_void_ptr_void_ptr_size_t *local_480;
  _func_void_ptr_void_ptr_size_t *local_478;
  yyjson_read_err *local_470;
  yyjson_doc *local_468;
  uint local_45c;
  ulong local_458;
  _func_void_ptr_void_ptr_size_t *local_450;
  u8 *local_448;
  bigint local_440;
  bigint local_238;
  
  local_4c0 = (_func_void_ptr_void_ptr_size_t *)cur;
  local_4b8 = (_func_void_ptr_void_ptr_size_t *)end;
  local_470 = err;
  pyVar28 = (yyjson_doc *)(*alc.malloc)(alc.ctx,0x50);
  p_Var32 = local_4b8;
  p_Var35 = local_4c0;
  if (pyVar28 == (yyjson_doc *)0x0) {
    bVar24 = is_truncated_end(hdr,(u8 *)local_4c0,(u8 *)local_4b8,2,flg);
    if (bVar24) {
      local_470->pos = (long)p_Var32 - (long)hdr;
      local_470->code = 5;
      pcVar39 = "unexpected end of data";
    }
    else {
      local_470->pos = (long)p_Var35 - (long)hdr;
      local_470->code = 2;
      pcVar39 = "memory allocation failed";
    }
    local_470->msg = pcVar39;
    return (yyjson_doc *)0x0;
  }
  val = pyVar28 + 1;
  cVar52 = (char)flg;
  local_448 = (u8 *)0x0;
  ppuVar47 = (u8 **)0x0;
  if ((flg & 0xa0) != 0) {
    ppuVar47 = &local_448;
  }
  bVar44 = (byte)*local_4c0;
  uVar31 = (ulong)bVar44;
  if ((char_table[uVar31] & 2) == 0) {
    if (0x6d < bVar44) {
      if (bVar44 == 0x6e) {
        if (*(uint *)local_4c0 == 0x6c6c756e) {
          val->root = (yyjson_val *)0x2;
LAB_0125d5da:
          local_4c0 = local_4c0 + 4;
          goto LAB_0125dbc5;
        }
        if (((((flg & 0x10) != 0) && (((byte)*local_4c0 | 0x20) == 0x6e)) &&
            (((byte)local_4c0[1] | 0x20) == 0x61)) && (((byte)local_4c0[2] | 0x20) == 0x6e)) {
          p_Var35 = local_4c0 + 3;
          if ((flg & 0xa0) == 0) {
            pyVar28[1].root = (yyjson_val *)0x14;
            local_4c0 = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
          }
          else {
            if (*ppuVar47 != (u8 *)0x0) {
              **ppuVar47 = '\0';
            }
            *ppuVar47 = (u8 *)p_Var35;
            pyVar28[1].root = (yyjson_val *)0x301;
          }
          pyVar28[1].alc.malloc = local_4c0;
          local_4c0 = p_Var35;
          goto LAB_0125dbc5;
        }
      }
      else {
        if (bVar44 != 0x74) goto LAB_0125d257;
        if (*(uint *)local_4c0 == 0x65757274) {
          val->root = (yyjson_val *)0xb;
          goto LAB_0125d5da;
        }
      }
LAB_0125e2b7:
      bVar24 = is_truncated_end(hdr,(u8 *)local_4c0,(u8 *)local_4b8,0xb,flg);
      if (bVar24) {
        p_Var35 = p_Var32;
      }
      yVar25 = 5;
      if (!bVar24) {
        yVar25 = 0xb;
      }
      pcVar39 = "invalid literal";
      if (bVar24) {
        pcVar39 = "unexpected end of data";
      }
      local_470->pos = (long)p_Var35 - (long)hdr;
      local_470->code = yVar25;
      local_470->msg = pcVar39;
      goto LAB_0125d2c4;
    }
    if (bVar44 == 0x22) {
      p_Var32 = local_4c0 + 1;
      p_Var35 = p_Var32;
LAB_0125d2d5:
      do {
        do {
          local_4c0 = p_Var35;
          if ((char_table[(byte)*local_4c0] & 0xc) == 0) {
            p_Var35 = local_4c0 + 8;
            do {
              local_4c0 = p_Var35;
              if ((char_table[(byte)local_4c0[-7]] & 0xc) != 0) {
                local_4c0 = local_4c0 + -7;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[-6]] & 0xc) != 0) {
                local_4c0 = local_4c0 + -6;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[-5]] & 0xc) != 0) {
                local_4c0 = local_4c0 + -5;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[-4]] & 0xc) != 0) {
                local_4c0 = local_4c0 + -4;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[-3]] & 0xc) != 0) {
                local_4c0 = local_4c0 + -3;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[-2]] & 0xc) != 0) {
                local_4c0 = local_4c0 + -2;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[-1]] & 0xc) != 0) {
                local_4c0 = local_4c0 + -1;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)*local_4c0] & 0xc) != 0) goto LAB_0125d41e;
              if ((char_table[(byte)local_4c0[1]] & 0xc) != 0) {
                local_4c0 = local_4c0 + 1;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[2]] & 0xc) != 0) {
                local_4c0 = local_4c0 + 2;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[3]] & 0xc) != 0) {
                local_4c0 = local_4c0 + 3;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[4]] & 0xc) != 0) {
                local_4c0 = local_4c0 + 4;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[5]] & 0xc) != 0) {
                local_4c0 = local_4c0 + 5;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[6]] & 0xc) != 0) {
                local_4c0 = local_4c0 + 6;
                goto LAB_0125d41e;
              }
              if ((char_table[(byte)local_4c0[7]] & 0xc) != 0) {
                local_4c0 = local_4c0 + 7;
                goto LAB_0125d41e;
              }
              p_Var35 = local_4c0 + 0x10;
            } while ((char_table[(byte)local_4c0[8]] & 0xc) == 0);
            local_4c0 = local_4c0 + 8;
          }
LAB_0125d41e:
          if (*local_4c0 == (_func_void_ptr_void_ptr_size_t)0x22) {
            pyVar28[1].root = (yyjson_val *)(((long)local_4c0 - (long)p_Var32) * 0x100 | 0xd);
            pyVar28[1].alc.malloc = p_Var32;
            *local_4c0 = (_func_void_ptr_void_ptr_size_t)0x0;
            local_4c0 = local_4c0 + 1;
            goto LAB_0125dbc5;
          }
          p_Var35 = local_4c0;
          if (-1 < (char)*local_4c0) goto LAB_0125ea46;
          uVar27 = *(uint *)local_4c0;
          while ((((uVar27 & 0xc0c0f0) == 0x8080e0 && ((uVar27 & 0x200f) != 0)) &&
                 ((uVar27 & 0x200f) != 0x200d))) {
            pcVar1 = p_Var35 + 3;
            p_Var35 = p_Var35 + 3;
            uVar27 = *(uint *)pcVar1;
          }
          local_4b0 = val;
          local_4a0 = ppuVar47;
          local_494 = flg;
          local_468 = pyVar28;
        } while (-1 < (char)uVar27);
        if ((uVar27 & 0x1e) != 0 && (uVar27 & 0xc0e0) == 0x80c0) {
          do {
            uVar27 = *(uint *)(p_Var35 + 2);
            p_Var35 = p_Var35 + 2;
            if ((uVar27 & 0xc0e0) != 0x80c0) break;
          } while ((uVar27 & 0x1e) != 0);
        }
        if ((uVar27 & 0x3007) != 0 && (uVar27 & 0xc0c0c0f8) == 0x808080f0) {
          while (((byte)uVar27 >> 2 & (uVar27 & 0x3003) != 0) == 0) {
            uVar27 = *(uint *)(p_Var35 + 4);
            p_Var35 = p_Var35 + 4;
            if (((uVar27 & 0xc0c0c0f8) != 0x808080f0) || ((uVar27 & 0x3007) == 0)) break;
          }
        }
      } while (local_4c0 != p_Var35);
      if ((flg & 0x40) != 0) {
        p_Var35 = p_Var35 + 1;
        goto LAB_0125d2d5;
      }
      local_488 = "invalid UTF-8 encoding in string";
      local_4c0 = p_Var35;
LAB_0125f052:
      p_Var35 = local_4c0;
      local_4b0 = val;
      local_4a0 = ppuVar47;
      local_494 = flg;
      local_468 = pyVar28;
      bVar24 = is_truncated_end(hdr,(u8 *)local_4c0,(u8 *)local_4b8,10,flg);
      if (bVar24) {
        local_470->pos = (long)local_4b8 - (long)hdr;
        local_470->code = 5;
        pcVar39 = "unexpected end of data";
      }
      else {
        local_470->pos = (long)p_Var35 - (long)hdr;
        local_470->code = 10;
        pcVar39 = local_488;
      }
      local_470->msg = pcVar39;
      pyVar28 = local_468;
      goto LAB_0125d2c4;
    }
    if (bVar44 == 0x66) {
      if (*(int *)(local_4c0 + 1) != 0x65736c61) goto LAB_0125e2b7;
      val->root = (yyjson_val *)0x3;
      local_4c0 = local_4c0 + 5;
      goto LAB_0125dbc5;
    }
LAB_0125d257:
    if ((flg & 0x10) == 0) {
LAB_0125d264:
      bVar24 = is_truncated_end(hdr,(u8 *)local_4c0,(u8 *)local_4b8,6,flg);
      if (bVar24) {
        p_Var35 = p_Var32;
      }
      pcVar39 = "unexpected character";
      if (bVar24) {
        pcVar39 = "unexpected end of data";
      }
      local_470->pos = (long)p_Var35 - (long)hdr;
      local_470->code = 6 - bVar24;
      local_470->msg = pcVar39;
LAB_0125d2c4:
      (*alc.free)(alc.ctx,pyVar28);
      return (yyjson_doc *)0x0;
    }
    if ((((bVar44 | 0x20) == 0x69) && (((byte)local_4c0[1] | 0x20) == 0x6e)) &&
       (((byte)local_4c0[2] | 0x20) == 0x66)) {
      p_Var35 = local_4c0 + 3;
      if (((((byte)local_4c0[3] | 0x20) == 0x69) && (((byte)local_4c0[4] | 0x20) == 0x6e)) &&
         ((((byte)local_4c0[5] | 0x20) == 0x69 &&
          ((((byte)local_4c0[6] | 0x20) == 0x74 && (((byte)local_4c0[7] | 0x20) == 0x79)))))) {
        p_Var35 = local_4c0 + 8;
      }
      if ((flg & 0xa0) != 0) {
        if (*ppuVar47 != (u8 *)0x0) {
          **ppuVar47 = '\0';
        }
        *ppuVar47 = (u8 *)p_Var35;
        pyVar28[1].root = (yyjson_val *)(((long)p_Var35 - (long)local_4c0) * 0x100 + 1);
        pyVar28[1].alc.malloc = local_4c0;
        local_4c0 = p_Var35;
        goto LAB_0125dbc5;
      }
      pyVar28[1].root = (yyjson_val *)0x14;
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
      local_4c0 = p_Var35;
    }
    else {
      if (((((byte)*local_4c0 | 0x20) != 0x6e) || (((byte)local_4c0[1] | 0x20) != 0x61)) ||
         (((byte)local_4c0[2] | 0x20) != 0x6e)) goto LAB_0125d264;
      p_Var35 = local_4c0 + 3;
      if ((flg & 0xa0) == 0) {
        pyVar28[1].root = (yyjson_val *)0x14;
        p_Var32 = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
        local_4c0 = p_Var35;
      }
      else {
        if (*ppuVar47 != (u8 *)0x0) {
          **ppuVar47 = '\0';
        }
        *ppuVar47 = (u8 *)p_Var35;
        pyVar28[1].root = (yyjson_val *)0x301;
        p_Var32 = local_4c0;
        local_4c0 = p_Var35;
      }
    }
    pyVar28[1].alc.malloc = p_Var32;
  }
  else {
    local_45c = 0;
    if (-1 < cVar52 && (flg & 0xa0) != 0) {
      local_4b0 = val;
      bVar24 = read_number_raw((u8 **)&local_4c0,ppuVar47,flg,(yyjson_val *)val,&local_488);
      goto LAB_0125dbb8;
    }
    uVar51 = (ulong)(bVar44 == 0x2d);
    p_Var35 = local_4c0 + uVar51;
    bVar33 = (byte)local_4c0[uVar51];
    uVar29 = (ulong)bVar33;
    local_478 = local_4c0;
    local_490 = uVar31;
    if ((digi_table[uVar29] & 2) == 0) {
      if (bVar33 != 0x30) {
        if ((flg & 0x10) != 0) {
          if ((((bVar33 | 0x20) == 0x69) && (((byte)p_Var35[1] | 0x20) == 0x6e)) &&
             (((byte)p_Var35[2] | 0x20) == 0x66)) {
            p_Var32 = p_Var35 + 3;
            if (((((byte)p_Var35[3] | 0x20) == 0x69) && (((byte)p_Var35[4] | 0x20) == 0x6e)) &&
               ((((byte)p_Var35[5] | 0x20) == 0x69 &&
                ((((byte)p_Var35[6] | 0x20) == 0x74 && (((byte)p_Var35[7] | 0x20) == 0x79)))))) {
              p_Var32 = p_Var35 + 8;
            }
            if ((flg & 0xa0) == 0) {
              pyVar28[1].root = (yyjson_val *)0x14;
              pyVar28[1].alc.malloc =
                   (_func_void_ptr_void_ptr_size_t *)
                   (((ulong)(bVar44 != 0x2d) << 0x3f) + -0x10000000000000);
            }
            else {
              if (*ppuVar47 != (u8 *)0x0) {
                **ppuVar47 = '\0';
              }
              *ppuVar47 = (u8 *)p_Var32;
              pyVar28[1].root =
                   (yyjson_val *)
                   (((long)p_Var32 - (long)(p_Var35 + -(ulong)(bVar44 == 0x2d))) * 0x100 + 1);
              pyVar28[1].alc.malloc = p_Var35 + -(ulong)(bVar44 == 0x2d);
            }
            bVar24 = true;
            p_Var35 = p_Var32;
          }
          else {
            bVar24 = false;
          }
          bVar18 = true;
          if (!bVar24) {
            if (((((byte)*p_Var35 | 0x20) == 0x6e) && (((byte)p_Var35[1] | 0x20) == 0x61)) &&
               (((byte)p_Var35[2] | 0x20) == 0x6e)) {
              if ((flg & 0xa0) == 0) {
                pyVar28[1].root = (yyjson_val *)0x14;
                p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                          (((ulong)(bVar44 != 0x2d) << 0x3f) + -0x8000000000000);
              }
              else {
                p_Var32 = p_Var35 + -(ulong)(bVar44 == 0x2d);
                if (*ppuVar47 != (u8 *)0x0) {
                  **ppuVar47 = '\0';
                }
                *ppuVar47 = (u8 *)(p_Var35 + 3);
                pyVar28[1].root = (yyjson_val *)((ulong)(bVar44 == 0x2d) * 0x100 + 0x301);
              }
              pyVar28[1].alc.malloc = p_Var32;
              p_Var35 = p_Var35 + 3;
            }
            else {
              bVar18 = false;
            }
          }
          local_4c0 = p_Var35;
          if (bVar18) goto LAB_0125dbc5;
        }
        local_488 = "no digit after minus sign";
        local_4c0 = p_Var35;
        goto LAB_0125dc4b;
      }
      p_Var32 = p_Var35 + 1;
      if ((digi_table[(byte)p_Var35[1]] & 0x33) == 0) {
        pyVar28[1].root = (yyjson_val *)((ulong)(bVar44 == 0x2d) * 8 + 4);
        pyVar28[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        local_4c0 = p_Var32;
      }
      else {
        if (p_Var35[1] == (_func_void_ptr_void_ptr_size_t)0x2e) {
          if ((digi_table[(byte)p_Var35[2]] & 3) == 0) {
            local_488 = "no digit after decimal point";
            local_4c0 = p_Var35 + 2;
            local_4b0 = val;
            local_4a8 = hdr;
            local_4a0 = ppuVar47;
            goto LAB_0125dc4b;
          }
          p_Var32 = local_4c0 + uVar51 + 1;
          do {
            p_Var43 = p_Var32;
            uVar31 = (ulong)(byte)p_Var43[1];
            p_Var32 = p_Var43 + 1;
          } while (uVar31 == 0x30);
          if ((digi_table[uVar31] & 3) != 0) {
            p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 - 0x30);
            goto LAB_0125f231;
          }
        }
        if ((digi_table[(byte)*p_Var32] & 3) != 0) {
          local_488 = "number with leading zero is not allowed";
          local_4c0 = p_Var32 + -1;
          local_4b0 = val;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          goto LAB_0125dc4b;
        }
        if ((digi_table[(byte)*p_Var32] & 0x20) != 0) {
          bVar24 = (digi_table[(byte)p_Var32[1]] & 0xc) == 0;
          p_Var35 = p_Var32 + (2 - (ulong)bVar24);
          p_Var32 = p_Var32 + (2 - (ulong)bVar24);
          if ((digi_table[(byte)*p_Var35] & 3) == 0) {
            local_488 = "no digit after exponent sign";
            local_4c0 = p_Var32;
            local_4b0 = val;
            local_4a8 = hdr;
            local_4a0 = ppuVar47;
            goto LAB_0125dc4b;
          }
          do {
            pcVar1 = p_Var32 + 1;
            p_Var32 = p_Var32 + 1;
          } while ((digi_table[(byte)*pcVar1] & 3) != 0);
        }
        pyVar28[1].root = (yyjson_val *)0x14;
        pyVar28[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar44 == 0x2d) << 0x3f);
        local_4c0 = p_Var32;
        local_4b0 = val;
        local_4a8 = hdr;
        local_4a0 = ppuVar47;
      }
      goto LAB_0125dbc5;
    }
    p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar29 - 0x30);
    cVar2 = p_Var35[1];
    uVar31 = (ulong)(byte)cVar2 - 0x30;
    if (9 < uVar31) {
      p_Var41 = p_Var35 + 1;
      if ((digi_table[(byte)cVar2] & 0x30) == 0) {
        pyVar28[1].root = (yyjson_val *)((ulong)(bVar44 == 0x2d) * 8 + 4);
        if (bVar44 == 0x2d) {
          p_Var32 = (_func_void_ptr_void_ptr_size_t *)(0x30 - uVar29);
        }
        pyVar28[1].alc.malloc = p_Var32;
        local_4c0 = p_Var41;
        local_4a8 = hdr;
        goto LAB_0125dbc5;
      }
      p_Var43 = p_Var35;
      if (cVar2 != (code)0x2e) goto LAB_0125f747;
LAB_0125f231:
      p_Var50 = p_Var35 + 1;
      if ((ulong)(byte)p_Var43[2] - 0x30 < 10) {
        p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                  (((ulong)(byte)p_Var43[2] - 0x30) + (long)p_Var32 * 10);
        p_Var35 = p_Var43;
LAB_0125f24c:
        if ((ulong)(byte)p_Var35[3] - 0x30 < 10) {
          p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                    (((ulong)(byte)p_Var35[3] - 0x30) + (long)p_Var32 * 10);
LAB_0125f267:
          if ((ulong)(byte)p_Var35[4] - 0x30 < 10) {
            p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)p_Var35[4] - 0x30) + (long)p_Var32 * 10);
LAB_0125f282:
            if ((ulong)(byte)p_Var35[5] - 0x30 < 10) {
              p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                        (((ulong)(byte)p_Var35[5] - 0x30) + (long)p_Var32 * 10);
LAB_0125f29d:
              if ((ulong)(byte)p_Var35[6] - 0x30 < 10) {
                p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                          (((ulong)(byte)p_Var35[6] - 0x30) + (long)p_Var32 * 10);
LAB_0125f2b8:
                if ((ulong)(byte)p_Var35[7] - 0x30 < 10) {
                  p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                            (((ulong)(byte)p_Var35[7] - 0x30) + (long)p_Var32 * 10);
LAB_0125f2d3:
                  if ((ulong)(byte)p_Var35[8] - 0x30 < 10) {
                    p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                              (((ulong)(byte)p_Var35[8] - 0x30) + (long)p_Var32 * 10);
LAB_0125f2ee:
                    if ((ulong)(byte)p_Var35[9] - 0x30 < 10) {
                      p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                (((ulong)(byte)p_Var35[9] - 0x30) + (long)p_Var32 * 10);
LAB_0125f309:
                      if ((ulong)(byte)p_Var35[10] - 0x30 < 10) {
                        p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                  (((ulong)(byte)p_Var35[10] - 0x30) + (long)p_Var32 * 10);
LAB_0125f324:
                        if ((ulong)(byte)p_Var35[0xb] - 0x30 < 10) {
                          p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                    (((ulong)(byte)p_Var35[0xb] - 0x30) + (long)p_Var32 * 10);
LAB_0125f33f:
                          if ((ulong)(byte)p_Var35[0xc] - 0x30 < 10) {
                            p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                      (((ulong)(byte)p_Var35[0xc] - 0x30) + (long)p_Var32 * 10);
LAB_0125f35a:
                            if ((ulong)(byte)p_Var35[0xd] - 0x30 < 10) {
                              p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                        (((ulong)(byte)p_Var35[0xd] - 0x30) + (long)p_Var32 * 10);
LAB_0125f375:
                              if ((ulong)(byte)p_Var35[0xe] - 0x30 < 10) {
                                p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                          (((ulong)(byte)p_Var35[0xe] - 0x30) + (long)p_Var32 * 10);
LAB_0125f390:
                                if ((ulong)(byte)p_Var35[0xf] - 0x30 < 10) {
                                  p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                            (((ulong)(byte)p_Var35[0xf] - 0x30) + (long)p_Var32 * 10
                                            );
LAB_0125f3ab:
                                  if ((ulong)(byte)p_Var35[0x10] - 0x30 < 10) {
                                    p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                              (((ulong)(byte)p_Var35[0x10] - 0x30) +
                                              (long)p_Var32 * 10);
LAB_0125f3c6:
                                    if ((ulong)(byte)p_Var35[0x11] - 0x30 < 10) {
                                      p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                                (((ulong)(byte)p_Var35[0x11] - 0x30) +
                                                (long)p_Var32 * 10);
LAB_0125f3e1:
                                      if ((ulong)(byte)p_Var35[0x12] - 0x30 < 10) {
                                        p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                                  (((ulong)(byte)p_Var35[0x12] - 0x30) +
                                                  (long)p_Var32 * 10);
LAB_0125f3fc:
                                        if ((ulong)(byte)p_Var35[0x13] - 0x30 < 10) {
                                          p_Var32 = (_func_void_ptr_void_ptr_size_t *)
                                                    (((ulong)(byte)p_Var35[0x13] - 0x30) +
                                                    (long)p_Var32 * 10);
                                          sig_cut = p_Var35 + 0x14;
                                          p_Var41 = sig_cut;
                                          if ((digi_table[(byte)p_Var35[0x14]] & 3) != 0)
                                          goto LAB_0125d6c3;
                                        }
                                        else {
                                          p_Var41 = p_Var35 + 0x13;
                                        }
                                      }
                                      else {
                                        p_Var41 = p_Var35 + 0x12;
                                      }
                                    }
                                    else {
                                      p_Var41 = p_Var35 + 0x11;
                                    }
                                  }
                                  else {
                                    p_Var41 = p_Var35 + 0x10;
                                  }
                                }
                                else {
                                  p_Var41 = p_Var35 + 0xf;
                                }
                              }
                              else {
                                p_Var41 = p_Var35 + 0xe;
                              }
                            }
                            else {
                              p_Var41 = p_Var35 + 0xd;
                            }
                          }
                          else {
                            p_Var41 = p_Var35 + 0xc;
                          }
                        }
                        else {
                          p_Var41 = p_Var35 + 0xb;
                        }
                      }
                      else {
                        p_Var41 = p_Var35 + 10;
                      }
                    }
                    else {
                      p_Var41 = p_Var35 + 9;
                    }
                  }
                  else {
                    p_Var41 = p_Var35 + 8;
                  }
                }
                else {
                  p_Var41 = p_Var35 + 7;
                }
              }
              else {
                p_Var41 = p_Var35 + 6;
              }
            }
            else {
              p_Var41 = p_Var35 + 5;
            }
          }
          else {
            p_Var41 = p_Var35 + 4;
          }
        }
        else {
          p_Var41 = p_Var35 + 3;
        }
      }
      else {
        p_Var41 = p_Var43 + 2;
      }
      if (p_Var50 + 1 == p_Var41) {
        local_488 = "no digit after decimal point";
        local_4c0 = p_Var41;
        local_4b0 = val;
        local_4a8 = hdr;
        local_4a0 = ppuVar47;
        goto LAB_0125dc4b;
      }
      p_Var43 = p_Var50 + (1 - (long)p_Var41);
      if ((digi_table[(byte)*p_Var41] & 0x20) != 0) goto LAB_0125f7d5;
      if (-0x158 < (long)p_Var43) {
        sig_cut = (_func_void_ptr_void_ptr_size_t *)0x0;
        local_4b0 = val;
        local_480 = p_Var41;
        goto LAB_0125d86a;
      }
      pyVar28[1].root = (yyjson_val *)0x14;
      p_Var35 = (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar44 == 0x2d) << 0x3f);
LAB_0125da08:
      pyVar28[1].alc.malloc = p_Var35;
      local_4c0 = p_Var41;
      local_4b0 = val;
      local_4a8 = hdr;
      local_4a0 = ppuVar47;
      goto LAB_0125dbc5;
    }
    p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
    cVar2 = p_Var35[2];
    uVar31 = (ulong)(byte)cVar2 - 0x30;
    if (uVar31 < 10) {
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[3];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 3;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f267;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[4];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 4;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f282;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[5];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 5;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f29d;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[6];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 6;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f2b8;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[7];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 7;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f2d3;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[8];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 8;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f2ee;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[9];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 9;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f309;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[10];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 10;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f324;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0xb];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0xb;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f33f;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0xc];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0xc;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f35a;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0xd];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0xd;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f375;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0xe];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0xe;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f390;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0xf];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0xf;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f3ab;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0x10];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0x10;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f3c6;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0x11];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0x11;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f3e1;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      cVar2 = p_Var35[0x12];
      uVar31 = (ulong)(byte)cVar2 - 0x30;
      if (9 < uVar31) {
        p_Var41 = p_Var35 + 0x12;
        if ((digi_table[(byte)cVar2] & 0x30) == 0) goto LAB_0125e10f;
        p_Var50 = p_Var41;
        if (cVar2 == (code)0x2e) goto LAB_0125f3fc;
        goto LAB_0125f747;
      }
      p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
      p_Var41 = p_Var35 + 0x13;
      cVar2 = p_Var35[0x13];
      bVar33 = digi_table[(byte)cVar2];
      if ((bVar33 & 0x33) == 0) {
        if ((bVar44 == 0x2d) && ((_func_void_ptr_void_ptr_size_t *)0x8000000000000000 < p_Var32)) {
          if (cVar52 < '\0') {
            if (*ppuVar47 != (u8 *)0x0) {
              **ppuVar47 = '\0';
            }
            pyVar28[1].root = (yyjson_val *)(((long)p_Var41 - (long)local_4c0) * 0x100 + 1);
            pyVar28[1].alc.malloc = local_4c0;
            *ppuVar47 = (u8 *)p_Var41;
            local_4c0 = p_Var41;
          }
          else {
            auVar53._8_4_ = (int)((ulong)p_Var32 >> 0x20);
            auVar53._0_8_ = p_Var32;
            auVar53._12_4_ = 0x45300000;
            pyVar28[1].root = (yyjson_val *)0x14;
            pyVar28[1].alc.malloc =
                 (_func_void_ptr_void_ptr_size_t *)
                 -((auVar53._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)p_Var32) - 4503599627370496.0));
            local_4c0 = p_Var41;
          }
        }
        else {
          pyVar28[1].root = (yyjson_val *)((ulong)(bVar44 == 0x2d) * 8 + 4);
          p_Var35 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var32;
          if (bVar44 != 0x2d) {
            p_Var35 = p_Var32;
          }
          pyVar28[1].alc.malloc = p_Var35;
          local_4c0 = p_Var41;
        }
        goto LAB_0125dbc5;
      }
      if (((bVar33 & 3) != 0) && ((digi_table[(byte)p_Var35[0x14]] & 0x33) == 0)) {
        uVar31 = (ulong)(byte)cVar2 - 0x30;
        if ((p_Var32 < (_func_void_ptr_void_ptr_size_t *)0x1999999999999999) ||
           ((p_Var32 == (_func_void_ptr_void_ptr_size_t *)0x1999999999999999 && (uVar31 < 6)))) {
          p_Var35 = p_Var35 + 0x14;
          p_Var32 = (_func_void_ptr_void_ptr_size_t *)(uVar31 + (long)p_Var32 * 10);
          if (bVar44 == 0x2d) {
            if (cVar52 < '\0') {
              if (*ppuVar47 != (u8 *)0x0) {
                **ppuVar47 = '\0';
              }
              pyVar28[1].root = (yyjson_val *)(((long)p_Var35 - (long)local_4c0) * 0x100 + 1);
              pyVar28[1].alc.malloc = local_4c0;
              *ppuVar47 = (u8 *)p_Var35;
              local_4c0 = p_Var35;
            }
            else {
              auVar54._8_4_ = (int)((ulong)p_Var32 >> 0x20);
              auVar54._0_8_ = p_Var32;
              auVar54._12_4_ = 0x45300000;
              pyVar28[1].root = (yyjson_val *)0x14;
              pyVar28[1].alc.malloc =
                   (_func_void_ptr_void_ptr_size_t *)
                   -((auVar54._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)p_Var32) - 4503599627370496.0));
              local_4c0 = p_Var35;
            }
          }
          else {
            pyVar28[1].root = (yyjson_val *)0x4;
            pyVar28[1].alc.malloc = p_Var32;
            local_4c0 = p_Var35;
          }
          goto LAB_0125dbc5;
        }
      }
      p_Var43 = (_func_void_ptr_void_ptr_size_t *)0x0;
      p_Var50 = p_Var41;
      if ((bVar33 & 0x20) != 0) {
        local_480 = (_func_void_ptr_void_ptr_size_t *)0x0;
        sig_cut = (_func_void_ptr_void_ptr_size_t *)0x0;
        goto LAB_0125d7d0;
      }
      if (cVar2 == (code)0x2e) {
        sig_cut = p_Var35 + 0x14;
        if ((digi_table[(byte)p_Var35[0x14]] & 3) == 0) {
          local_488 = "no digit after decimal point";
          local_4c0 = sig_cut;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          goto LAB_0125dc4b;
        }
      }
      else {
        sig_cut = p_Var41;
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)0x0;
      }
LAB_0125d6c3:
      pyVar45 = (yyjson_val *)((long)sig_cut * 0x100 + (long)local_4c0 * -0x100 + 1);
      p_Var35 = sig_cut + 1;
      do {
        p_Var41 = p_Var35;
        p_Var35 = p_Var41 + 1;
        pyVar45 = pyVar45 + 0x10;
      } while ((digi_table[(byte)*p_Var41] & 3) != 0);
      if (p_Var50 == (_func_void_ptr_void_ptr_size_t *)0x0) {
        if ((cVar52 < '\0') && ((digi_table[(byte)*p_Var41] & 0x30) == 0)) {
          if (*ppuVar47 != (u8 *)0x0) {
            **ppuVar47 = '\0';
          }
          pyVar28[1].root = pyVar45;
          pyVar28[1].alc.malloc = local_4c0;
          *ppuVar47 = (u8 *)p_Var41;
          local_4c0 = p_Var41;
          local_4b0 = val;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          goto LAB_0125dbc5;
        }
        p_Var50 = p_Var41;
        if (*p_Var41 == (_func_void_ptr_void_ptr_size_t)0x2e) {
          if ((digi_table[(byte)*p_Var35] & 3) == 0) {
            local_488 = "no digit after decimal point";
            local_4c0 = p_Var35;
            local_4b0 = val;
            local_4a8 = hdr;
            local_4a0 = ppuVar47;
            goto LAB_0125dc4b;
          }
          do {
            pcVar1 = p_Var41 + 1;
            p_Var41 = p_Var41 + 1;
          } while ((digi_table[(byte)*pcVar1] & 3) != 0);
        }
      }
      p_Var32 = p_Var32 + (0x34 < (byte)*sig_cut);
      p_Var35 = p_Var41;
      do {
        do {
          p_Var35 = p_Var35 + -1;
        } while (*p_Var35 == (_func_void_ptr_void_ptr_size_t)0x30);
      } while (*p_Var35 == (_func_void_ptr_void_ptr_size_t)0x2e);
      p_Var43 = p_Var50 + ((ulong)(p_Var50 < sig_cut) - (long)sig_cut);
      local_480 = p_Var41;
      if (p_Var35 < sig_cut) {
        sig_cut = (_func_void_ptr_void_ptr_size_t *)0x0;
        local_480 = (_func_void_ptr_void_ptr_size_t *)0x0;
      }
      local_4b0 = val;
      if ((digi_table[(byte)*p_Var41] & 0x20) != 0) goto LAB_0125d7d0;
LAB_0125d850:
      if (-0x158 < (long)p_Var43) {
        if (0x134 < (long)p_Var43) {
          if (-1 < cVar52) {
            if ((flg & 0x10) == 0) {
              local_488 = "number is infinity when parsed as double";
              local_4a8 = hdr;
              local_4a0 = ppuVar47;
              goto LAB_0125dc4b;
            }
            pyVar28[1].root = (yyjson_val *)0x14;
            pyVar28[1].alc.malloc =
                 (_func_void_ptr_void_ptr_size_t *)
                 (((ulong)(bVar44 != 0x2d) << 0x3f) + -0x10000000000000);
            local_4c0 = p_Var41;
            local_4a8 = hdr;
            local_4a0 = ppuVar47;
            goto LAB_0125dbc5;
          }
          if (*ppuVar47 != (u8 *)0x0) {
            **ppuVar47 = '\0';
          }
          pyVar28[1].root = (yyjson_val *)(((long)p_Var41 - (long)local_4c0) * 0x100 + 1);
          pyVar28[1].alc.malloc = local_4c0;
LAB_0125f59e:
          *ppuVar47 = (u8 *)p_Var41;
          local_4c0 = p_Var41;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          goto LAB_0125dbc5;
        }
LAB_0125d86a:
        local_45c = (uint)p_Var43;
        if (((ulong)p_Var32 >> 0x35 == 0) && (local_45c + 0x16 < 0x2d)) {
          if ((int)local_45c < 0) {
            p_Var35 = (_func_void_ptr_void_ptr_size_t *)
                      ((double)(long)p_Var32 / *(double *)(f64_pow10_table + (ulong)-local_45c * 8))
            ;
          }
          else {
            p_Var35 = (_func_void_ptr_void_ptr_size_t *)
                      ((double)(long)p_Var32 *
                      *(double *)(f64_pow10_table + (ulong)(local_45c & 0x7fffffff) * 8));
          }
          pyVar28[1].root = (yyjson_val *)0x14;
          if (bVar44 == 0x2d) {
            p_Var35 = (_func_void_ptr_void_ptr_size_t *)((ulong)p_Var35 ^ 0x8000000000000000);
          }
          pyVar28[1].alc.malloc = p_Var35;
          local_4c0 = p_Var41;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          goto LAB_0125dbc5;
        }
        local_450 = p_Var50;
        if ((local_45c + 0x132 < 0x252) && (sig_cut == (_func_void_ptr_void_ptr_size_t *)0x0)) {
          uVar31 = 0x3f;
          if (p_Var32 != (_func_void_ptr_void_ptr_size_t *)0x0) {
            for (; (ulong)p_Var32 >> uVar31 == 0; uVar31 = uVar31 - 1) {
            }
          }
          uVar51 = (long)p_Var32 << ((byte)(uVar31 ^ 0x3f) & 0x3f);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar51;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_45c * 2 + 0x2ae) * 8);
          auVar6 = auVar6 * auVar11;
          lVar36 = auVar6._8_8_;
          uVar29 = auVar6._0_8_;
          bVar24 = true;
          if (0x1fd < (ulong)(auVar6._8_4_ & 0x1ff) - 1) {
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar51;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_45c * 2 + 0x2af) * 8);
            lVar37 = SUB168(auVar7 * auVar12,8);
            if ((lVar37 + uVar29) - 1 < 0xfffffffffffffffe) {
              lVar36 = lVar36 + (ulong)(lVar37 + uVar29 < uVar29);
            }
            else {
              bVar24 = false;
            }
          }
          if (bVar24) {
            uVar29 = lVar36 << (-1 < lVar36);
            uVar29 = (uVar29 & 0x400) + uVar29;
            pyVar28[1].root = (yyjson_val *)0x14;
            p_Var35 = (_func_void_ptr_void_ptr_size_t *)
                      ((ulong)(bVar44 == 0x2d) << 0x3f |
                      uVar29 >> 0xb & 0xfffffffffffff |
                      (ulong)(((((int)(local_45c * 0x3526a + -0x3f0000) >> 0x10) -
                               (int)(uVar31 ^ 0x3f)) - (uint)(-1 < lVar36)) + 0x47e +
                             (uint)(uVar29 < 0x400)) << 0x34);
            local_494 = flg;
            goto LAB_0125da08;
          }
        }
        uVar31 = 0x3f;
        if (p_Var32 != (_func_void_ptr_void_ptr_size_t *)0x0) {
          for (; (ulong)p_Var32 >> uVar31 == 0; uVar31 = uVar31 - 1) {
          }
        }
        bVar33 = (byte)(uVar31 ^ 0x3f);
        lVar36 = ((ulong)(sig_cut != (_func_void_ptr_void_ptr_size_t *)0x0) << 2) << (bVar33 & 0x3f)
        ;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(long *)(pow10_sig_table + (long)(int)(local_45c * 2 + 0x2ae) * 8) -
                       (*(long *)(pow10_sig_table + (long)(int)(local_45c * 2 + 0x2af) * 8) >> 0x3f)
        ;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = (long)p_Var32 << (bVar33 & 0x3f);
        uVar51 = SUB168(auVar8 * auVar13,8) - (SUB168(auVar8 * auVar13,0) >> 0x3f);
        uVar29 = 0x3f;
        if (uVar51 != 0) {
          for (; uVar51 >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        bVar33 = (byte)(uVar29 ^ 0x3f);
        uVar51 = uVar51 << (bVar33 & 0x3f);
        uVar46 = (9 - (ulong)(lVar36 == 0)) + lVar36 << (bVar33 & 0x3f);
        iVar48 = (((int)(local_45c * 0x3526a + -0x3f0000) >> 0x10) -
                 ((int)(uVar31 ^ 0x3f) + (int)(uVar29 ^ 0x3f))) + 0x40;
        iVar49 = 0xb;
        if (iVar48 < -0x43d) {
          iVar49 = 0x40;
          if (-0x472 < iVar48) {
            iVar49 = -0x432 - iVar48;
          }
        }
        if (0x3c < iVar49) {
          bVar33 = (char)iVar49 - 0x3c;
          uVar51 = uVar51 >> (bVar33 & 0x3f);
          iVar48 = iVar48 + iVar49 + -0x3c;
          uVar46 = (uVar46 >> (bVar33 & 0x3f)) + 9;
          iVar49 = 0x3c;
        }
        bVar33 = (byte)iVar49;
        uVar29 = (~(-1L << (bVar33 & 0x3f)) & uVar51) * 8;
        lVar36 = 8L << (bVar33 - 1 & 0x3f);
        uVar31 = lVar36 + uVar46;
        uVar51 = (ulong)(uVar31 <= uVar29) + (uVar51 >> (bVar33 & 0x3f));
        if (uVar51 == 0) {
          uVar38 = 0;
        }
        else {
          uVar5 = 0x3f;
          if (uVar51 != 0) {
            for (; uVar51 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          iVar49 = (iVar48 + iVar49) - (int)(uVar5 ^ 0x3f);
          uVar38 = 0x7ff0000000000000;
          if (iVar49 < 0x3c1) {
            uVar38 = (uVar51 << ((byte)(uVar5 ^ 0x3f) & 0x3f)) >> 0xb;
            if (iVar49 < -0x43d) {
              if (iVar49 < -0x471) {
                uVar38 = 0;
              }
              else {
                uVar38 = uVar38 >> (-(char)iVar49 - 0x3dU & 0x3f);
              }
            }
            else {
              uVar38 = uVar38 & 0xfffffffffffff | (ulong)(iVar49 + 0x43e) << 0x34;
            }
          }
        }
        p_Var35 = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
        if (uVar38 == 0x7ff0000000000000) {
          if (-1 < cVar52) {
            if ((flg & 0x10) == 0) {
              local_488 = "number is infinity when parsed as double";
              bVar24 = false;
              local_4b0 = val;
              local_4a8 = hdr;
              local_4a0 = ppuVar47;
              local_494 = flg;
            }
            else {
              if (bVar44 == 0x2d) {
                p_Var35 = (_func_void_ptr_void_ptr_size_t *)0xfff0000000000000;
              }
              pyVar28[1].root = (yyjson_val *)0x14;
              pyVar28[1].alc.malloc = p_Var35;
              bVar24 = true;
              local_4c0 = p_Var41;
              local_4b0 = val;
              local_4a8 = hdr;
              local_4a0 = ppuVar47;
              local_494 = flg;
            }
            goto LAB_0125dbb8;
          }
          if (*ppuVar47 != (u8 *)0x0) {
            **ppuVar47 = '\0';
          }
          pyVar28[1].root = (yyjson_val *)(((long)p_Var41 - (long)local_4c0) * 0x100 + 1);
          pyVar28[1].alc.malloc = local_4c0;
          *ppuVar47 = (u8 *)p_Var41;
          local_4b0 = val;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          local_494 = flg;
LAB_0125f610:
          bVar24 = true;
          hdr = local_4a8;
          ppuVar47 = local_4a0;
          flg = local_494;
          local_4c0 = p_Var41;
        }
        else if ((lVar36 - uVar46 < uVar29) && (uVar29 < uVar31)) {
          uVar27 = 0xfffffbcd;
          if (0xfffffffffffff < uVar38) {
            uVar27 = (uint)(uVar38 >> 0x34) - 0x434;
          }
          uVar31 = (uVar38 & 0xfffffffffffff) + 0x10000000000000;
          if (0xfffffffffffff >= uVar38) {
            uVar31 = uVar38;
          }
          big = &local_440;
          local_4b0 = val;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          local_494 = flg;
          local_468 = pyVar28;
          local_458 = uVar38;
          bigint_set_buf(big,(u64)p_Var32,(i32 *)&local_45c,(u8 *)sig_cut,(u8 *)local_480,
                         (u8 *)p_Var50);
          local_238.used = 1;
          local_238.bits[0] = uVar31 * 2 + 1;
          if ((int)local_45c < 0) {
            iVar48 = -local_45c;
            local_238.used = 1;
            iVar49 = iVar48;
            if ((int)local_45c < -0x12) {
              do {
                uVar29 = (ulong)local_238.used;
                uVar31 = 0;
                if (local_238.used != 0) {
                  uVar31 = 0;
                  do {
                    if (local_238.bits[uVar31] != 0) goto LAB_0125e60a;
                    uVar31 = uVar31 + 1;
                  } while (local_238.used != (uint)uVar31);
                  uVar31 = (ulong)local_238.used;
                }
LAB_0125e60a:
                if ((uint)uVar31 < local_238.used) {
                  uVar31 = uVar31 & 0xffffffff;
                  uVar40 = 0;
                  do {
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = uVar40;
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = local_238.bits[uVar31];
                    auVar20 = ZEXT816(10000000000000000000) * auVar15 + auVar20;
                    uVar40 = auVar20._8_8_;
                    local_238.bits[uVar31] = auVar20._0_8_;
                    uVar31 = uVar31 + 1;
                  } while (uVar29 != uVar31);
                }
                else {
                  uVar40 = 0;
                }
                if (uVar40 != 0) {
                  local_238.used = local_238.used + 1;
                  local_238.bits[uVar29] = uVar40;
                }
                iVar49 = iVar48 + -0x13;
                bVar24 = 0x25 < iVar48;
                iVar48 = iVar49;
              } while (bVar24);
            }
            if (iVar49 != 0) {
              uVar29 = (ulong)local_238.used;
              uVar31 = 0;
              if (uVar29 != 0) {
                do {
                  if (local_238.bits[uVar31] != 0) goto LAB_0125e774;
                  uVar31 = uVar31 + 1;
                } while (local_238.used != (uint)uVar31);
                uVar31 = (ulong)local_238.used;
              }
LAB_0125e774:
              if ((uint)uVar31 < local_238.used) {
                uVar51 = *(ulong *)(u64_pow10_table + (long)iVar49 * 8);
                uVar31 = uVar31 & 0xffffffff;
                uVar40 = 0;
                do {
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = uVar40;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = uVar51;
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = local_238.bits[uVar31];
                  auVar22 = auVar10 * auVar17 + auVar22;
                  uVar40 = auVar22._8_8_;
                  local_238.bits[uVar31] = auVar22._0_8_;
                  uVar31 = uVar31 + 1;
                } while (uVar29 != uVar31);
              }
              else {
                uVar40 = 0;
              }
              if (uVar40 != 0) {
                big = &local_238;
                local_238.used = local_238.used + 1;
                goto LAB_0125e7f3;
              }
            }
          }
          else {
            uVar26 = local_45c;
            uVar42 = local_45c;
            if (0x12 < (int)local_45c) {
              do {
                uVar29 = (ulong)local_440.used;
                uVar31 = 0;
                if (local_440.used != 0) {
                  uVar31 = 0;
                  do {
                    if (local_440.bits[uVar31] != 0) goto LAB_0125e522;
                    uVar31 = uVar31 + 1;
                  } while (local_440.used != (uint)uVar31);
                  uVar31 = (ulong)local_440.used;
                }
LAB_0125e522:
                if ((uint)uVar31 < local_440.used) {
                  uVar31 = uVar31 & 0xffffffff;
                  uVar40 = 0;
                  do {
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = uVar40;
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = local_440.bits[uVar31];
                    auVar19 = ZEXT816(10000000000000000000) * auVar14 + auVar19;
                    uVar40 = auVar19._8_8_;
                    local_440.bits[uVar31] = auVar19._0_8_;
                    uVar31 = uVar31 + 1;
                  } while (uVar29 != uVar31);
                }
                else {
                  uVar40 = 0;
                }
                if (uVar40 != 0) {
                  local_440.used = local_440.used + 1;
                  local_440.bits[uVar29] = uVar40;
                }
                uVar26 = uVar42 - 0x13;
                bVar24 = 0x25 < (int)uVar42;
                uVar42 = uVar26;
              } while (bVar24);
            }
            if (uVar26 != 0) {
              uVar29 = (ulong)local_440.used;
              uVar31 = 0;
              if (uVar29 != 0) {
                do {
                  if (local_440.bits[uVar31] != 0) goto LAB_0125e6cf;
                  uVar31 = uVar31 + 1;
                } while (local_440.used != (uint)uVar31);
                uVar31 = (ulong)local_440.used;
              }
LAB_0125e6cf:
              if ((uint)uVar31 < local_440.used) {
                uVar51 = *(ulong *)(u64_pow10_table + (long)(int)uVar26 * 8);
                uVar31 = uVar31 & 0xffffffff;
                uVar40 = 0;
                do {
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = uVar40;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = uVar51;
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = local_440.bits[uVar31];
                  auVar21 = auVar9 * auVar16 + auVar21;
                  uVar40 = auVar21._8_8_;
                  local_440.bits[uVar31] = auVar21._0_8_;
                  uVar31 = uVar31 + 1;
                } while (uVar29 != uVar31);
              }
              else {
                uVar40 = 0;
              }
              if (uVar40 != 0) {
                local_440.used = local_440.used + 1;
LAB_0125e7f3:
                big->bits[uVar29] = uVar40;
              }
            }
          }
          if ((int)uVar27 < 1) {
            uVar27 = -uVar27;
            uVar26 = uVar27 >> 6;
            uVar31 = (ulong)local_440.used;
            if ((uVar27 & 0x3f) == 0) {
              if (uVar31 != 0) {
                do {
                  local_440.bits[((uVar27 >> 6) - 1) + (int)uVar31] = local_440.bits[uVar31 - 1];
                  uVar31 = uVar31 - 1;
                } while (uVar31 != 0);
              }
              local_440.used = local_440.used + uVar26;
            }
            else {
              local_440.bits[uVar31] = 0;
              sVar34 = (sbyte)(uVar27 & 0x3f);
              if (uVar31 != 0) {
                do {
                  local_440.bits[(uVar27 >> 6) + (int)uVar31] =
                       local_440.bits[uVar31 - 1] >> (0x40U - sVar34 & 0x3f) |
                       local_440.bits[uVar31] << sVar34;
                  uVar31 = uVar31 - 1;
                } while (uVar31 != 0);
              }
              local_440.bits[uVar26] = local_440.bits[0] << sVar34;
              local_440.used =
                   (local_440.used + uVar26 + 1) -
                   (uint)(local_440.bits[local_440.used + uVar26] == 0);
            }
            if (0x3f < uVar27) {
              __s = local_440.bits;
              goto LAB_0125e96b;
            }
          }
          else {
            __s = local_238.bits;
            uVar26 = uVar27 >> 6;
            uVar31 = (ulong)local_238.used;
            if ((uVar27 & 0x3f) == 0) {
              if (uVar31 != 0) {
                do {
                  local_238.bits[((uVar27 >> 6) - 1) + (int)uVar31] = local_238.bits[uVar31 - 1];
                  uVar31 = uVar31 - 1;
                } while (uVar31 != 0);
              }
              local_238.used = local_238.used + uVar26;
            }
            else {
              local_238.bits[uVar31] = 0;
              sVar34 = (sbyte)(uVar27 & 0x3f);
              if (uVar31 != 0) {
                do {
                  local_238.bits[(uVar27 >> 6) + (int)uVar31] =
                       local_238.bits[uVar31 - 1] >> (0x40U - sVar34 & 0x3f) |
                       local_238.bits[uVar31] << sVar34;
                  uVar31 = uVar31 - 1;
                } while (uVar31 != 0);
              }
              local_238.bits[uVar26] = local_238.bits[0] << sVar34;
              local_238.used =
                   (local_238.used + uVar26 + 1) -
                   (uint)(local_238.bits[local_238.used + uVar26] == 0);
              if (uVar27 < 0x40) goto LAB_0125e97d;
            }
LAB_0125e96b:
            switchD_00570541::default(__s,0,(ulong)(uVar26 - 1) * 8 + 8);
          }
LAB_0125e97d:
          uVar31 = (ulong)local_440.used;
          iVar49 = -1;
          if (local_238.used <= local_440.used) {
            iVar48 = 1;
            iVar49 = 1;
            if (local_440.used <= local_238.used) {
              do {
                if (uVar31 == 0) {
                  iVar49 = 0;
                  break;
                }
                uVar29 = local_440.bits[uVar31 - 1];
                uVar51 = local_238.bits[uVar31 - 1];
                iVar49 = iVar48;
                if (uVar29 >= uVar51 && uVar29 != uVar51) {
                  iVar49 = 1;
                }
                if (uVar29 < uVar51) {
                  iVar49 = -1;
                }
                uVar31 = uVar31 - 1;
                iVar48 = iVar49;
              } while (uVar29 == uVar51);
            }
          }
          if (iVar49 == 0) {
            uVar31 = (ulong)((uint)local_458 & 1);
          }
          else {
            uVar31 = (ulong)(0 < iVar49);
          }
          p_Var35 = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
          pyVar28 = local_468;
          hdr = local_4a8;
          ppuVar47 = local_4a0;
          flg = local_494;
          if (uVar31 + local_458 == 0x7ff0000000000000) {
            if ((char)local_494 < '\0') {
              if (*local_4a0 != (u8 *)0x0) {
                **local_4a0 = '\0';
              }
              local_468[1].root = (yyjson_val *)(((long)p_Var41 - (long)local_478) * 0x100 + 1);
              local_468[1].alc.malloc = local_478;
              *local_4a0 = (u8 *)p_Var41;
              goto LAB_0125f610;
            }
            if ((local_494 & 0x10) == 0) {
              local_488 = "number is infinity when parsed as double";
              local_4c0 = local_478;
              bVar24 = false;
              goto LAB_0125dbb8;
            }
            if ((int)local_490 == 0x2d) {
              p_Var35 = (_func_void_ptr_void_ptr_size_t *)0xfff0000000000000;
            }
            local_468[1].root = (yyjson_val *)0x14;
            local_468[1].alc.malloc = p_Var35;
          }
          else {
            local_468[1].root = (yyjson_val *)0x14;
            local_468[1].alc.malloc =
                 (_func_void_ptr_void_ptr_size_t *)
                 (uVar31 + local_458 | (ulong)((int)local_490 == 0x2d) << 0x3f);
          }
          bVar24 = true;
          local_4c0 = p_Var41;
        }
        else {
          pyVar28[1].root = (yyjson_val *)0x14;
          pyVar28[1].alc.malloc =
               (_func_void_ptr_void_ptr_size_t *)(uVar38 | (ulong)(bVar44 == 0x2d) << 0x3f);
          bVar24 = true;
          local_4c0 = p_Var41;
          local_4b0 = val;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          local_494 = flg;
        }
LAB_0125dbb8:
        val = local_4b0;
        if (bVar24 == false) {
LAB_0125dc4b:
          p_Var32 = local_4b8;
          p_Var35 = local_4c0;
          bVar24 = is_truncated_end(hdr,(u8 *)local_4c0,(u8 *)local_4b8,9,flg);
          if (bVar24) {
            local_470->pos = (long)p_Var32 - (long)hdr;
            local_470->code = 5;
            pcVar39 = "unexpected end of data";
          }
          else {
            local_470->pos = (long)p_Var35 - (long)hdr;
            local_470->code = 9;
            pcVar39 = local_488;
          }
          local_470->msg = pcVar39;
          (*alc.free)(alc.ctx,pyVar28);
          return (yyjson_doc *)0x0;
        }
        goto LAB_0125dbc5;
      }
    }
    else {
      p_Var41 = p_Var35 + 2;
      if ((digi_table[(byte)cVar2] & 0x30) == 0) {
LAB_0125e10f:
        pyVar28[1].root = (yyjson_val *)((ulong)(bVar44 == 0x2d) * 8 + 4);
        p_Var35 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var32;
        if (bVar44 != 0x2d) {
          p_Var35 = p_Var32;
        }
        pyVar28[1].alc.malloc = p_Var35;
        local_4c0 = p_Var41;
        local_4a8 = hdr;
        goto LAB_0125dbc5;
      }
      p_Var50 = p_Var41;
      if (cVar2 == (code)0x2e) goto LAB_0125f24c;
LAB_0125f747:
      p_Var43 = (_func_void_ptr_void_ptr_size_t *)0x0;
      p_Var50 = p_Var41;
LAB_0125f7d5:
      sig_cut = (_func_void_ptr_void_ptr_size_t *)0x0;
      local_4b0 = val;
      local_480 = p_Var41;
LAB_0125d7d0:
      cVar2 = p_Var41[1];
      uVar31 = (ulong)((digi_table[(byte)cVar2] & 0xc) != 0);
      if ((digi_table[(byte)p_Var41[uVar31 + 1]] & 3) == 0) {
        local_488 = "no digit after exponent sign";
        local_4c0 = p_Var41 + uVar31 + 1;
        local_4a8 = hdr;
        local_4a0 = ppuVar47;
        goto LAB_0125dc4b;
      }
      p_Var35 = p_Var41 + uVar31;
      p_Var41 = p_Var35;
      do {
        p_Var35 = p_Var35 + 1;
        pcVar1 = p_Var41 + 1;
        p_Var41 = p_Var41 + 1;
      } while (*pcVar1 == (code)0x30);
      uVar31 = (ulong)(byte)*p_Var41;
      if ((digi_table[uVar31] & 3) == 0) {
        lVar36 = 0;
      }
      else {
        lVar36 = 0;
        do {
          lVar36 = (ulong)(byte)((char)uVar31 - 0x30) + lVar36 * 10;
          uVar31 = (ulong)(byte)p_Var41[1];
          p_Var41 = p_Var41 + 1;
        } while ((digi_table[uVar31] & 3) != 0);
      }
      if ((long)p_Var41 - (long)p_Var35 < 0x13) {
        lVar37 = -lVar36;
        if (cVar2 != (code)0x2d) {
          lVar37 = lVar36;
        }
        p_Var43 = p_Var43 + lVar37;
        goto LAB_0125d850;
      }
      if (cVar2 != (code)0x2d) {
        if (-1 < cVar52) {
          if ((flg & 0x10) == 0) {
            local_488 = "number is infinity when parsed as double";
            local_4a8 = hdr;
            local_4a0 = ppuVar47;
            goto LAB_0125dc4b;
          }
          pyVar28[1].root = (yyjson_val *)0x14;
          pyVar28[1].alc.malloc =
               (_func_void_ptr_void_ptr_size_t *)
               (((ulong)(bVar44 != 0x2d) << 0x3f) + -0x10000000000000);
          local_4c0 = p_Var41;
          local_4a8 = hdr;
          local_4a0 = ppuVar47;
          goto LAB_0125dbc5;
        }
        if (*ppuVar47 != (u8 *)0x0) {
          **ppuVar47 = '\0';
        }
        pyVar28[1].root = (yyjson_val *)(((long)p_Var41 - (long)local_4c0) * 0x100 + 1);
        pyVar28[1].alc.malloc = local_4c0;
        goto LAB_0125f59e;
      }
    }
    pyVar28[1].root = (yyjson_val *)0x14;
    pyVar28[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar44 == 0x2d) << 0x3f);
    local_4c0 = p_Var41;
    local_4a8 = hdr;
    local_4a0 = ppuVar47;
  }
LAB_0125dbc5:
  if ((local_4c0 < local_4b8) && ((flg & 2) == 0)) {
    if ((flg & 8) == 0) {
      local_4c0 = local_4c0 + -1;
      do {
        pcVar1 = local_4c0 + 1;
        local_4c0 = local_4c0 + 1;
      } while ((char_table[(byte)*pcVar1] & 1) != 0);
    }
    else {
      bVar24 = skip_spaces_and_comments((u8 **)&local_4c0);
      p_Var32 = local_4b8;
      p_Var35 = local_4c0;
      if ((!bVar24) && (*(short *)local_4c0 == 0x2a2f)) {
        bVar24 = is_truncated_end(hdr,(u8 *)local_4c0,(u8 *)local_4b8,8,flg);
        if (bVar24) {
          p_Var35 = p_Var32;
        }
        pcVar39 = "unclosed multiline comment";
        if (bVar24) {
          pcVar39 = "unexpected end of data";
        }
        local_470->pos = (long)p_Var35 - (long)hdr;
        local_470->code = (uint)!bVar24 * 3 + 5;
        local_470->msg = pcVar39;
        goto LAB_0125f14c;
      }
    }
    p_Var32 = local_4b8;
    p_Var35 = local_4c0;
    if (local_4c0 < local_4b8) {
      bVar24 = is_truncated_end(hdr,(u8 *)local_4c0,(u8 *)local_4b8,4,flg);
      if (bVar24) {
        p_Var35 = p_Var32;
      }
      pcVar39 = "unexpected content after document";
      if (bVar24) {
        pcVar39 = "unexpected end of data";
      }
      local_470->pos = (long)p_Var35 - (long)hdr;
      local_470->code = bVar24 + 4;
      local_470->msg = pcVar39;
LAB_0125f14c:
      (*alc.free)(alc.ctx,pyVar28);
      return (yyjson_doc *)0x0;
    }
  }
  if (((flg & 0xa0) != 0) && (*ppuVar47 != (u8 *)0x0)) {
    **ppuVar47 = '\0';
  }
  pyVar28->root = (yyjson_val *)val;
  (pyVar28->alc).malloc = alc.malloc;
  (pyVar28->alc).realloc = alc.realloc;
  (pyVar28->alc).free = alc.free;
  (pyVar28->alc).ctx = alc.ctx;
  pyVar28->dat_read = (long)local_4c0 - (long)hdr;
  pyVar28->val_read = 1;
  puVar30 = (u8 *)0x0;
  if ((flg & 1) == 0) {
    puVar30 = hdr;
  }
  pyVar28->str_pool = (char *)puVar30;
  return pyVar28;
LAB_0125ea46:
  bVar44 = (byte)*local_4c0;
  if (bVar44 != 0x5c) {
    if (bVar44 != 0x22) {
      if ((flg & 0x40) == 0) {
        local_488 = "unexpected control character in string";
      }
      else {
        if (local_4c0 < local_4b8) {
          *p_Var35 = (_func_void_ptr_void_ptr_size_t)bVar44;
          p_Var35 = p_Var35 + 1;
          p_Var43 = local_4c0 + 1;
          goto LAB_0125eb6e;
        }
        local_488 = "unclosed string";
      }
      goto LAB_0125f052;
    }
    pyVar28[1].root = (yyjson_val *)(((long)p_Var35 - (long)p_Var32) * 0x100 | 5);
    pyVar28[1].alc.malloc = p_Var32;
    *p_Var35 = (_func_void_ptr_void_ptr_size_t)0x0;
    local_4c0 = local_4c0 + 1;
    local_4b0 = val;
    local_4a0 = ppuVar47;
    local_494 = flg;
    local_468 = pyVar28;
    goto LAB_0125dbc5;
  }
  cVar2 = local_4c0[1];
  if ((byte)cVar2 < 0x62) {
    if (cVar2 == (code)0x22) {
      *p_Var35 = (_func_void_ptr_void_ptr_size_t)0x22;
    }
    else if (cVar2 == (code)0x2f) {
      *p_Var35 = (_func_void_ptr_void_ptr_size_t)0x2f;
    }
    else {
      if (cVar2 != (code)0x5c) goto switchD_0125ea87_caseD_6f;
      *p_Var35 = (_func_void_ptr_void_ptr_size_t)0x5c;
    }
  }
  else {
    switch(cVar2) {
    case (code)0x6e:
      *p_Var35 = (_func_void_ptr_void_ptr_size_t)0xa;
      break;
    case (code)0x6f:
    case (code)0x70:
    case (code)0x71:
    case (code)0x73:
switchD_0125ea87_caseD_6f:
      local_4c0 = local_4c0 + 1;
      local_488 = "invalid escaped character in string";
      goto LAB_0125f052;
    case (code)0x72:
      *p_Var35 = (_func_void_ptr_void_ptr_size_t)0xd;
      break;
    case (code)0x74:
      *p_Var35 = (_func_void_ptr_void_ptr_size_t)0x9;
      break;
    case (code)0x75:
      uVar23 = CONCAT11(hex_conv_table[(byte)local_4c0[3]],hex_conv_table[(byte)local_4c0[5]]);
      if (((uVar23 | CONCAT11(hex_conv_table[(byte)local_4c0[2]],hex_conv_table[(byte)local_4c0[4]])
           ) & 0xf0f0) != 0) {
        local_488 = "invalid escaped sequence in string";
        goto LAB_0125f052;
      }
      uVar27 = (uint)CONCAT11(hex_conv_table[(byte)local_4c0[2]],hex_conv_table[(byte)local_4c0[4]])
               << 4;
      uVar26 = uVar23 | uVar27;
      p_Var43 = local_4c0 + 6;
      if ((uVar26 & 0xf800) != 0xd800) {
        uVar27 = (uint)uVar23 | uVar27 & 0xffff;
        bVar44 = (byte)uVar26;
        if (uVar27 < 0x800) {
          if (uVar27 < 0x80) {
            *p_Var35 = (_func_void_ptr_void_ptr_size_t)bVar44;
            p_Var35 = p_Var35 + 1;
          }
          else {
            *p_Var35 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar26 >> 6) | 0xc0);
            p_Var35[1] = (_func_void_ptr_void_ptr_size_t)(bVar44 & 0x3f | 0x80);
            p_Var35 = p_Var35 + 2;
          }
        }
        else {
          *p_Var35 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar27 >> 0xc) | 0xe0);
          p_Var35[1] = (_func_void_ptr_void_ptr_size_t)((byte)(uVar26 >> 6) & 0x3f | 0x80);
          p_Var35[2] = (_func_void_ptr_void_ptr_size_t)(bVar44 & 0x3f | 0x80);
          p_Var35 = p_Var35 + 3;
        }
        goto LAB_0125eb6e;
      }
      if ((uVar26 & 0xdc00) != 0xd800) {
        local_488 = "invalid high surrogate in string";
        goto LAB_0125f052;
      }
      if (*(short *)p_Var43 != 0x755c) {
        local_488 = "no low surrogate in string";
        local_4c0 = p_Var43;
        goto LAB_0125f052;
      }
      if (((CONCAT11(hex_conv_table[(byte)local_4c0[9]],hex_conv_table[(byte)local_4c0[0xb]]) |
           CONCAT11(hex_conv_table[(byte)local_4c0[8]],hex_conv_table[(byte)local_4c0[10]])) &
          0xf0f0) != 0) {
        local_488 = "invalid escaped sequence in string";
        local_4c0 = p_Var43;
        goto LAB_0125f052;
      }
      uVar27 = (CONCAT11(hex_conv_table[(byte)local_4c0[8]],hex_conv_table[(byte)local_4c0[10]]) &
               0xfff) << 4 |
               (uint)CONCAT11(hex_conv_table[(byte)local_4c0[9]],
                              hex_conv_table[(byte)local_4c0[0xb]]);
      if ((uVar27 & 0xfc00) != 0xdc00) {
        local_488 = "invalid low surrogate in string";
        local_4c0 = p_Var43;
        goto LAB_0125f052;
      }
      iVar49 = (uVar26 & 0xdbff) * 0x400;
      uVar26 = iVar49 + uVar27 + 0xfca02400;
      *p_Var35 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar26 >> 0x12) | 0xf0);
      p_Var35[1] = (_func_void_ptr_void_ptr_size_t)((byte)(uVar26 >> 0xc) & 0x3f | 0x80);
      p_Var35[2] = (_func_void_ptr_void_ptr_size_t)
                   ((byte)(uVar27 + iVar49 + 0x400 >> 6) & 0x3f | 0x80);
      p_Var35[3] = (_func_void_ptr_void_ptr_size_t)((byte)uVar27 & 0x3f | 0x80);
      p_Var35 = p_Var35 + 4;
      p_Var43 = local_4c0 + 0xc;
      goto LAB_0125eb6e;
    default:
      if (cVar2 == (code)0x62) {
        *p_Var35 = (_func_void_ptr_void_ptr_size_t)0x8;
      }
      else {
        if (cVar2 != (code)0x66) goto switchD_0125ea87_caseD_6f;
        *p_Var35 = (_func_void_ptr_void_ptr_size_t)0xc;
      }
    }
  }
  p_Var35 = p_Var35 + 1;
  p_Var43 = local_4c0 + 2;
LAB_0125eb6e:
  do {
    local_4c0 = p_Var43;
    if ((char_table[(byte)*local_4c0] & 0xc) != 0) {
LAB_0125edad:
      while( true ) {
        if (-1 < (char)*local_4c0) goto LAB_0125ea46;
        uVar27 = *(uint *)local_4c0;
        p_Var43 = local_4c0;
        while ((((uVar27 & 0xc0c0f0) == 0x8080e0 && ((uVar27 & 0x200f) != 0)) &&
               ((uVar27 & 0x200f) != 0x200d))) {
          *(uint *)p_Var35 = uVar27;
          p_Var35 = p_Var35 + 3;
          pcVar1 = p_Var43 + 3;
          p_Var43 = p_Var43 + 3;
          uVar27 = *(uint *)pcVar1;
        }
        if (-1 < (char)uVar27) break;
        if ((uVar27 & 0x1e) != 0 && (uVar27 & 0xc0e0) == 0x80c0) {
          do {
            *(short *)p_Var35 = (short)uVar27;
            p_Var35 = p_Var35 + 2;
            uVar27 = *(uint *)(p_Var43 + 2);
            p_Var43 = p_Var43 + 2;
            if ((uVar27 & 0xc0e0) != 0x80c0) break;
          } while ((uVar27 & 0x1e) != 0);
        }
        if ((uVar27 & 0x3007) != 0 && (uVar27 & 0xc0c0c0f8) == 0x808080f0) {
          while (((byte)uVar27 >> 2 & (uVar27 & 0x3003) != 0) == 0) {
            *(uint *)p_Var35 = uVar27;
            p_Var35 = p_Var35 + 4;
            uVar27 = *(uint *)(p_Var43 + 4);
            p_Var43 = p_Var43 + 4;
            if (((uVar27 & 0x3007) == 0) || ((uVar27 & 0xc0c0c0f8) != 0x808080f0)) break;
          }
        }
        if (local_4c0 != p_Var43) break;
        if ((flg & 0x40) == 0) {
          local_488 = "invalid UTF-8 encoding in string";
          local_4c0 = p_Var43;
          goto LAB_0125f052;
        }
LAB_0125ee99:
        *(undefined2 *)p_Var35 = *(undefined2 *)p_Var43;
        local_4c0 = p_Var43 + 1;
        p_Var35 = p_Var35 + 1;
      }
      goto LAB_0125eb6e;
    }
    p_Var43 = local_4c0;
    if ((char_table[(byte)local_4c0[1]] & 0xc) != 0) goto LAB_0125ee99;
    if ((char_table[(byte)local_4c0[2]] & 0xc) != 0) {
      uVar3 = *(undefined2 *)local_4c0;
      local_4c0 = local_4c0 + 2;
      *(undefined2 *)p_Var35 = uVar3;
      p_Var35 = p_Var35 + 2;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[3]] & 0xc) != 0) {
      uVar27 = *(uint *)local_4c0;
      local_4c0 = local_4c0 + 3;
      *(uint *)p_Var35 = uVar27;
      p_Var35 = p_Var35 + 3;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[4]] & 0xc) != 0) {
      uVar27 = *(uint *)local_4c0;
      local_4c0 = local_4c0 + 4;
      *(uint *)p_Var35 = uVar27;
      p_Var35 = p_Var35 + 4;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[5]] & 0xc) != 0) {
      *(uint *)p_Var35 = *(uint *)local_4c0;
      *(undefined2 *)(p_Var35 + 4) = *(undefined2 *)(local_4c0 + 4);
      p_Var35 = p_Var35 + 5;
      local_4c0 = local_4c0 + 5;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[6]] & 0xc) != 0) {
      *(uint *)p_Var35 = *(uint *)local_4c0;
      *(undefined2 *)(p_Var35 + 4) = *(undefined2 *)(local_4c0 + 4);
      p_Var35 = p_Var35 + 6;
      local_4c0 = local_4c0 + 6;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[7]] & 0xc) != 0) {
      uVar4 = *(undefined8 *)local_4c0;
      local_4c0 = local_4c0 + 7;
      *(undefined8 *)p_Var35 = uVar4;
      p_Var35 = p_Var35 + 7;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[8]] & 0xc) != 0) {
      uVar4 = *(undefined8 *)local_4c0;
      local_4c0 = local_4c0 + 8;
      *(undefined8 *)p_Var35 = uVar4;
      p_Var35 = p_Var35 + 8;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[9]] & 0xc) != 0) {
      *(undefined8 *)p_Var35 = *(undefined8 *)local_4c0;
      *(undefined2 *)(p_Var35 + 8) = *(undefined2 *)(local_4c0 + 8);
      p_Var35 = p_Var35 + 9;
      local_4c0 = local_4c0 + 9;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[10]] & 0xc) != 0) {
      *(undefined8 *)p_Var35 = *(undefined8 *)local_4c0;
      *(undefined2 *)(p_Var35 + 8) = *(undefined2 *)(local_4c0 + 8);
      p_Var35 = p_Var35 + 10;
      local_4c0 = local_4c0 + 10;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[0xb]] & 0xc) != 0) {
      *(undefined8 *)p_Var35 = *(undefined8 *)local_4c0;
      *(uint *)(p_Var35 + 8) = *(uint *)(local_4c0 + 8);
      p_Var35 = p_Var35 + 0xb;
      local_4c0 = local_4c0 + 0xb;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[0xc]] & 0xc) != 0) {
      *(undefined8 *)p_Var35 = *(undefined8 *)local_4c0;
      *(uint *)(p_Var35 + 8) = *(uint *)(local_4c0 + 8);
      p_Var35 = p_Var35 + 0xc;
      local_4c0 = local_4c0 + 0xc;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[0xd]] & 0xc) != 0) {
      *(undefined8 *)p_Var35 = *(undefined8 *)local_4c0;
      *(uint *)(p_Var35 + 8) = *(uint *)(local_4c0 + 8);
      *(undefined2 *)(p_Var35 + 0xc) = *(undefined2 *)(local_4c0 + 0xc);
      p_Var35 = p_Var35 + 0xd;
      local_4c0 = local_4c0 + 0xd;
      goto LAB_0125edad;
    }
    if ((char_table[(byte)local_4c0[0xe]] & 0xc) != 0) {
      *(undefined8 *)p_Var35 = *(undefined8 *)local_4c0;
      *(uint *)(p_Var35 + 8) = *(uint *)(local_4c0 + 8);
      *(undefined2 *)(p_Var35 + 0xc) = *(undefined2 *)(local_4c0 + 0xc);
      p_Var35 = p_Var35 + 0xe;
      local_4c0 = local_4c0 + 0xe;
      goto LAB_0125edad;
    }
    bVar44 = char_table[(byte)local_4c0[0xf]];
    uVar4 = *(undefined8 *)(local_4c0 + 8);
    *(undefined8 *)p_Var35 = *(undefined8 *)local_4c0;
    *(undefined8 *)(p_Var35 + 8) = uVar4;
    if ((bVar44 & 0xc) != 0) {
      local_4c0 = local_4c0 + 0xf;
      p_Var35 = p_Var35 + 0xf;
      goto LAB_0125edad;
    }
    p_Var35 = p_Var35 + 0x10;
    p_Var43 = local_4c0 + 0x10;
  } while( true );
}

Assistant:

static_noinline yyjson_doc *read_root_single(u8 *hdr,
                                             u8 *cur,
                                             u8 *end,
                                             yyjson_alc alc,
                                             yyjson_read_flag flg,
                                             yyjson_read_err *err) {

#define return_err(_pos, _code, _msg) do { \
    if (is_truncated_end(hdr, _pos, end, YYJSON_READ_ERROR_##_code, flg)) { \
        err->pos = (usize)(end - hdr); \
        err->code = YYJSON_READ_ERROR_UNEXPECTED_END; \
        err->msg = "unexpected end of data"; \
    } else { \
        err->pos = (usize)(_pos - hdr); \
        err->code = YYJSON_READ_ERROR_##_code; \
        err->msg = _msg; \
    } \
    if (val_hdr) alc.free(alc.ctx, (void *)val_hdr); \
    return NULL; \
} while (false)

    usize hdr_len; /* value count used by doc */
    usize alc_num; /* value count capacity */
    yyjson_val *val_hdr; /* the head of allocated values */
    yyjson_val *val; /* current value */
    yyjson_doc *doc; /* the JSON document, equals to val_hdr */
    const char *msg; /* error message */

    bool raw; /* read number as raw */
    bool inv; /* allow invalid unicode */
    u8 *raw_end; /* raw end for null-terminator */
    u8 **pre; /* previous raw end pointer */

    hdr_len = sizeof(yyjson_doc) / sizeof(yyjson_val);
    hdr_len += (sizeof(yyjson_doc) % sizeof(yyjson_val)) > 0;
    alc_num = hdr_len + 1; /* single value */

    val_hdr = (yyjson_val *)alc.malloc(alc.ctx, alc_num * sizeof(yyjson_val));
    if (unlikely(!val_hdr)) goto fail_alloc;
    val = val_hdr + hdr_len;
    raw = has_read_flag(NUMBER_AS_RAW) || has_read_flag(BIGNUM_AS_RAW);
    inv = has_read_flag(ALLOW_INVALID_UNICODE) != 0;
    raw_end = NULL;
    pre = raw ? &raw_end : NULL;

    if (char_is_number(*cur)) {
        if (likely(read_number(&cur, pre, flg, val, &msg))) goto doc_end;
        goto fail_number;
    }
    if (*cur == '"') {
        if (likely(read_string(&cur, end, inv, val, &msg))) goto doc_end;
        goto fail_string;
    }
    if (*cur == 't') {
        if (likely(read_true(&cur, val))) goto doc_end;
        goto fail_literal;
    }
    if (*cur == 'f') {
        if (likely(read_false(&cur, val))) goto doc_end;
        goto fail_literal;
    }
    if (*cur == 'n') {
        if (likely(read_null(&cur, val))) goto doc_end;
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (read_nan(false, &cur, pre, val)) goto doc_end;
        }
        goto fail_literal;
    }
    if (has_read_flag(ALLOW_INF_AND_NAN)) {
        if (read_inf_or_nan(false, &cur, pre, val)) goto doc_end;
    }
    goto fail_character;

doc_end:
    /* check invalid contents after json document */
    if (unlikely(cur < end) && !has_read_flag(STOP_WHEN_DONE)) {
        if (has_read_flag(ALLOW_COMMENTS)) {
            if (!skip_spaces_and_comments(&cur)) {
                if (byte_match_2(cur, "/*")) goto fail_comment;
            }
        } else {
            while (char_is_space(*cur)) cur++;
        }
        if (unlikely(cur < end)) goto fail_garbage;
    }

    if (pre && *pre) **pre = '\0';
    doc = (yyjson_doc *)val_hdr;
    doc->root = val_hdr + hdr_len;
    doc->alc = alc;
    doc->dat_read = (usize)(cur - hdr);
    doc->val_read = 1;
    doc->str_pool = has_read_flag(INSITU) ? NULL : (char *)hdr;
    return doc;

fail_string:
    return_err(cur, INVALID_STRING, msg);
fail_number:
    return_err(cur, INVALID_NUMBER, msg);
fail_alloc:
    return_err(cur, MEMORY_ALLOCATION, "memory allocation failed");
fail_literal:
    return_err(cur, LITERAL, "invalid literal");
fail_comment:
    return_err(cur, INVALID_COMMENT, "unclosed multiline comment");
fail_character:
    return_err(cur, UNEXPECTED_CHARACTER, "unexpected character");
fail_garbage:
    return_err(cur, UNEXPECTED_CONTENT, "unexpected content after document");

#undef return_err
}